

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDrawTests.cpp
# Opt level: O2

int __thiscall deqp::gles2::Functional::DrawTests::init(DrawTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  TestCaseGroup *pTVar2;
  DrawMethod method;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  long lVar3;
  string desc;
  string name;
  
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
    uVar1 = *(uint *)((long)Functional::anon_unknown_0::RandomGroup::init::drawMethods + lVar3);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              (&name,(DrawTestSpec *)(ulong)uVar1,(DrawMethod)in_RDX);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              (&desc,(DrawTestSpec *)(ulong)uVar1,method);
    pTVar2 = (TestCaseGroup *)operator_new(0x80);
    TestCaseGroup::TestCaseGroup
              (pTVar2,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
               desc._M_dataplus._M_p);
    (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e22098;
    *(uint *)&pTVar2[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = uVar1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
    in_RDX = extraout_RDX;
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"random","random draw commands.");
  (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e221d8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  return extraout_EAX;
}

Assistant:

void DrawTests::init (void)
{
	// Basic
	{
		const gls::DrawTestSpec::DrawMethod basicMethods[] =
		{
			gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(basicMethods); ++ndx)
		{
			std::string name = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);
			std::string desc = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);

			this->addChild(new MethodGroup(m_context, name.c_str(), desc.c_str(), basicMethods[ndx]));
		}
	}

	// Random

	this->addChild(new RandomGroup(m_context, "random", "random draw commands."));
}